

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uchar __thiscall ON_SubDDisplayParameters::EncodeAsUnsignedChar(ON_SubDDisplayParameters *this)

{
  bool bVar1;
  bool bVar2;
  ON_SubDComponentLocation OVar3;
  ON_SubDComponentLocation OVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte local_35;
  uchar nondefault_settings;
  uchar compute_curvature_as_char;
  uchar absoute_density_as_char;
  uchar location;
  uchar density_as_char;
  uchar density;
  uchar encoded_parameters;
  uchar default_display_density;
  uchar max_display_density;
  ON_SubDDisplayParameters *this_local;
  
  if ((this->m_display_density == '\x04') || (6 < this->m_display_density)) {
    bVar1 = DisplayDensityIsAdaptive(&Default);
    bVar2 = DisplayDensityIsAdaptive(this);
    if (bVar1 == bVar2) {
      OVar3 = MeshLocation(&Default);
      OVar4 = MeshLocation(this);
      if (OVar3 == OVar4) {
        bVar1 = ComputeCurvature(&Default);
        bVar2 = ComputeCurvature(this);
        if (bVar1 == bVar2) {
          return '\0';
        }
      }
    }
  }
  if (this->m_display_density < 7) {
    local_35 = this->m_display_density;
  }
  else {
    local_35 = 4;
  }
  OVar3 = MeshLocation(this);
  bVar6 = 0;
  if (OVar3 == ControlNet) {
    bVar6 = 8;
  }
  bVar7 = 0;
  if ((this->m_bDisplayDensityIsAbsolute & 1U) != 0) {
    bVar7 = 0x10;
  }
  bVar5 = 0;
  if ((this->m_bComputeCurvature & 1U) != 0) {
    bVar5 = 0x20;
  }
  return local_35 & 7 | 0x80 | bVar7 | bVar5 | bVar6;
}

Assistant:

unsigned char ON_SubDDisplayParameters::EncodeAsUnsignedChar() const
{
  const unsigned char max_display_density = ((unsigned char)ON_SubDDisplayParameters::MaximumDensity);
  const unsigned char default_display_density = ((unsigned char)ON_SubDDisplayParameters::DefaultDensity);
  unsigned char encoded_parameters;
  if (
    (default_display_density == m_display_density || m_display_density > max_display_density)
    && ON_SubDDisplayParameters::Default.DisplayDensityIsAdaptive() == DisplayDensityIsAdaptive()
    && ON_SubDDisplayParameters::Default.MeshLocation() == MeshLocation()
    && ON_SubDDisplayParameters::Default.ComputeCurvature() == ComputeCurvature()
    )
  {
    // use defaults
    encoded_parameters = 0;
  }
  else
  {
    const unsigned char density
      = (m_display_density <= max_display_density)
      ? m_display_density
      : default_display_density
      ;

    const unsigned char density_as_char = (density & ON_SubDDisplayParameters::subd_mesh_density_mask);

    const unsigned char location
      = (ON_SubDComponentLocation::ControlNet == MeshLocation())
      ? ON_SubDDisplayParameters::subd_mesh_location_bit
      : 0;

    const unsigned char absoute_density_as_char
      = m_bDisplayDensityIsAbsolute
      ? ON_SubDDisplayParameters::subd_mesh_absolute_density_bit
      : 0;

    const unsigned char compute_curvature_as_char
      = m_bComputeCurvature
      ? ON_SubDDisplayParameters::subd_mesh_compute_curvature_bit
      : 0;

    const unsigned char nondefault_settings = ON_SubDDisplayParameters::subd_mesh_nondefault_bit;

    encoded_parameters
      = nondefault_settings
      | density_as_char
      | absoute_density_as_char
      | compute_curvature_as_char
      | location
      ;
  }
  return encoded_parameters;
}